

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ProtocolTCP.cpp
# Opt level: O3

void __thiscall
ProtocolTCP::ProcessRx(ProtocolTCP *this,DataBuffer *rxBuffer,uint8_t *sourceIP,uint8_t *targetIP)

{
  osQueue *this_00;
  uint8_t *packet;
  bool bVar1;
  byte bVar2;
  uint16_t uVar3;
  uint16_t localPort;
  uint16_t uVar4;
  uint32_t uVar5;
  uint32_t uVar6;
  int iVar7;
  TCPConnection *this_01;
  TCPConnection *pTVar8;
  uint64_t uVar9;
  DataBuffer *buffer;
  uint8_t uVar10;
  
  packet = rxBuffer->Packet;
  uVar3 = ComputeChecksum(packet,rxBuffer->Length,sourceIP,targetIP);
  if (uVar3 != 0) {
    puts("TCP Checksum Failure");
    return;
  }
  uVar3 = Unpack16(packet,0);
  localPort = Unpack16(packet,2);
  uVar5 = Unpack32(packet,4);
  uVar6 = Unpack32(packet,8);
  bVar2 = Unpack8(packet,0xc);
  bVar2 = bVar2 >> 2 & 0x3c;
  uVar4 = Unpack16(packet,0xe);
  rxBuffer->Packet = rxBuffer->Packet + bVar2;
  rxBuffer->Length = rxBuffer->Length - (ushort)bVar2;
  this_01 = LocateConnection(this,uVar3,sourceIP,localPort);
  if (this_01 == (TCPConnection *)0x0) {
    printf("Connection port %d not found\n",(ulong)localPort);
    return;
  }
  switch(this_01->State) {
  case CLOSED:
    Reset(this,rxBuffer->MAC,localPort,uVar3,sourceIP);
    break;
  case LISTEN:
    if ((packet[0xd] & 2) != 0) {
      pTVar8 = NewClient(this,rxBuffer->MAC,sourceIP,uVar3,localPort);
      if (pTVar8 == (TCPConnection *)0x0) {
        puts("Failed to get connection for SYN");
      }
      else {
        TCPConnection::Allocate(pTVar8,rxBuffer->MAC);
        pTVar8->Parent = this_01;
        pTVar8->State = SYN_RECEIVED;
        pTVar8->LastAck = uVar5;
        pTVar8->AcknowledgementNumber = uVar5 + 1;
        TCPConnection::SendFlags(pTVar8,'\x12');
        pTVar8->SequenceNumber = pTVar8->SequenceNumber + 1;
        this_01 = pTVar8;
      }
    }
    break;
  case SYN_SENT:
    if ((packet[0xd] & 2) == 0) break;
    this_01->AcknowledgementNumber = uVar5;
    this_01->LastAck = uVar5;
    if ((packet[0xd] & 0x10) == 0) {
      this_01->State = SYN_RECEIVED;
      this_01->AcknowledgementNumber = uVar5 + 1;
      uVar10 = '\x12';
      goto LAB_0010722c;
    }
    this_01->State = ESTABLISHED;
    goto LAB_00107221;
  case SYN_RECEIVED:
    if ((packet[0xd] & 0x10) != 0) {
      this_01->State = ESTABLISHED;
      pTVar8 = this_01->Parent;
      if (pTVar8->NewConnection == (TCPConnection *)0x0) {
        this_01->MaxSequenceTx = uVar4 + uVar6;
        pTVar8->NewConnection = this_01;
        osEvent::Notify(&pTVar8->Event);
      }
    }
    break;
  case ESTABLISHED:
    if ((packet[0xd] & 1) == 0) break;
    this_01->State = CLOSE_WAIT;
    goto LAB_0010721e;
  case FIN_WAIT_1:
    bVar2 = packet[0xd];
    if ((bVar2 & 1) == 0) {
      if ((bVar2 & 0x10) != 0) {
        this_01->State = FIN_WAIT_2;
      }
      break;
    }
    this_01->State = (bVar2 & 0x10) >> 3 | CLOSING;
LAB_0010721e:
    this_01->AcknowledgementNumber = this_01->AcknowledgementNumber + 1;
LAB_00107221:
    uVar10 = '\x10';
LAB_0010722c:
    TCPConnection::SendFlags(this_01,uVar10);
    break;
  case FIN_WAIT_2:
    if ((packet[0xd] & 1) == 0) break;
    this_01->State = TIMED_WAIT;
    this_01->AcknowledgementNumber = this_01->AcknowledgementNumber + 1;
    uVar9 = osTime::GetTime();
    this_01->Time_us = (uint32_t)uVar9;
    uVar10 = '\x10';
    goto LAB_0010722c;
  case LAST_ACK:
    if ((packet[0xd] & 0x10) != 0) {
      this_01->State = CLOSED;
    }
  }
  if ((this_01->State & ~SYN_RECEIVED) == ESTABLISHED) {
    uVar3 = rxBuffer->Length;
    this_01->MaxSequenceTx = uVar4 + uVar6;
    osEvent::Notify(&this_01->Event);
    bVar2 = packet[0xd];
    if ((bVar2 & 0x10) != 0) {
      osMutex::Take(&this_01->HoldingQueueLock,
                    "/workspace/llm4binary/github/license_c_cmakelists/rkimball[P]tinytcp/tcp_stack/ProtocolTCP.cpp"
                    ,0xe0);
      this_00 = &this_01->HoldingQueue;
      iVar7 = osQueue::GetCount(this_00);
      uVar9 = osTime::GetTime();
      if (0 < iVar7) {
        do {
          buffer = (DataBuffer *)osQueue::Get(this_00);
          if ((int)(uVar6 - buffer->AcknowledgementNumber) < 0) {
            osQueue::Put(this_00,buffer);
          }
          else {
            TCPConnection::CalculateRTT(this_01,(int)uVar9 - buffer->Time_us);
            ProtocolIPv4::FreeTxBuffer(this->IP,buffer);
          }
          iVar7 = iVar7 + -1;
        } while (iVar7 != 0);
      }
      osMutex::Give(&this_01->HoldingQueueLock);
      bVar2 = packet[0xd];
    }
    bVar1 = true;
    if ((bVar2 & 1) == 0) {
      uVar10 = '\0';
    }
    else if ((this_01->State & ~LISTEN) == ESTABLISHED) {
      this_01->State = CLOSE_WAIT;
      uVar10 = '\x10';
      bVar1 = false;
    }
    else {
      uVar10 = '\0';
    }
    if (uVar3 != 0) {
      rxBuffer->Disposable = false;
      TCPConnection::StoreRxData(this_01,rxBuffer);
      ProtocolIPv4::FreeRxBuffer(this->IP,rxBuffer);
      osEvent::Notify(&this_01->Event);
    }
    if (!bVar1) {
      TCPConnection::SendFlags(this_01,uVar10);
      return;
    }
  }
  return;
}

Assistant:

void ProtocolTCP::ProcessRx(DataBuffer* rxBuffer, const uint8_t* sourceIP, const uint8_t* targetIP)
{
    TCPConnection* connection;
    uint16_t checksum;
    uint16_t localPort;
    uint16_t remotePort;
    uint8_t headerLength;
    uint8_t* data;
    uint16_t dataLength;
    int count;
    DataBuffer* buffer;
    uint8_t flags = 0;
    uint8_t* packet = rxBuffer->Packet;
    uint16_t length = rxBuffer->Length;
    uint16_t remoteWindowSize;
    uint32_t time_us;

    uint32_t SequenceNumber;
    uint32_t AcknowledgementNumber;

    checksum = ComputeChecksum(packet, length, sourceIP, targetIP);

    if (checksum == 0)
    {
        // pass
        remotePort = Unpack16(packet, 0);
        localPort = Unpack16(packet, 2);
        SequenceNumber = Unpack32(packet, 4);
        AcknowledgementNumber = Unpack32(packet, 8);
        headerLength = (Unpack8(packet, 12) >> 4) * 4;
        remoteWindowSize = Unpack16(packet, 14);

        rxBuffer->Packet += headerLength;
        rxBuffer->Length -= headerLength;

        connection = LocateConnection(remotePort, sourceIP, localPort);
        if (connection == nullptr)
        {
            // No connection found
            printf("Connection port %d not found\n", localPort);
        }
        else
        {
            // Existing connection, process the state machine
            switch (connection->State)
            {
            case TCPConnection::CLOSED:
                // Do nothing
                Reset(rxBuffer->MAC, localPort, remotePort, sourceIP);
                break;
            case TCPConnection::LISTEN:
                if (SYN)
                {
                    // Need a closed connection to work with
                    TCPConnection* tmp = NewClient(rxBuffer->MAC, sourceIP, remotePort, localPort);
                    if (tmp != nullptr)
                    {
                        tmp->Allocate(rxBuffer->MAC);
                        tmp->Parent = connection;
                        connection = tmp;
                        connection->State = TCPConnection::SYN_RECEIVED;
                        connection->AcknowledgementNumber = SequenceNumber;
                        connection->LastAck = connection->AcknowledgementNumber;
                        connection->AcknowledgementNumber++; // SYN flag consumes a sequence number
                        connection->SendFlags(FLAG_SYN | FLAG_ACK);
                        connection->SequenceNumber++; // Our SYN costs too
                    }
                    else
                    {
                        printf("Failed to get connection for SYN\n");
                    }
                }
                break;
            case TCPConnection::SYN_SENT:
                if (SYN)
                {
                    connection->AcknowledgementNumber = SequenceNumber;
                    connection->LastAck = connection->AcknowledgementNumber;
                    if (ACK)
                    {
                        connection->State = TCPConnection::ESTABLISHED;
                        connection->SendFlags(FLAG_ACK);
                    }
                    else
                    {
                        // Simultaneous open
                        connection->State = TCPConnection::SYN_RECEIVED;
                        connection->AcknowledgementNumber++; // SYN flag consumes a sequence number
                        connection->SendFlags(FLAG_SYN | FLAG_ACK);
                    }
                }
                break;
            case TCPConnection::SYN_RECEIVED:
                if (ACK)
                {
                    connection->State = TCPConnection::ESTABLISHED;

                    if (connection->Parent->NewConnection == nullptr)
                    {
                        connection->MaxSequenceTx = AcknowledgementNumber + remoteWindowSize;
                        connection->Parent->NewConnection = connection;
                        connection->Parent->Event.Notify();
                    }
                }
                break;
            case TCPConnection::ESTABLISHED:
                if (FIN)
                {
                    connection->State = TCPConnection::CLOSE_WAIT;
                    connection->AcknowledgementNumber++; // FIN consumes sequence number
                    connection->SendFlags(FLAG_ACK);
                }
                break;
            case TCPConnection::FIN_WAIT_1:
                if (FIN)
                {
                    if (ACK)
                    {
                        connection->State = TCPConnection::TIMED_WAIT;
                        // Start TimedWait timer
                    }
                    else
                    {
                        connection->State = TCPConnection::CLOSING;
                    }
                    connection->AcknowledgementNumber++; // FIN consumes sequence number
                    connection->SendFlags(FLAG_ACK);
                }
                else if (ACK)
                {
                    connection->State = TCPConnection::FIN_WAIT_2;
                }
                break;
            case TCPConnection::FIN_WAIT_2:
                if (FIN)
                {
                    connection->State = TCPConnection::TIMED_WAIT;
                    // Start TimedWait timer
                    connection->AcknowledgementNumber++; // FIN consumes sequence number
                    connection->Time_us = (int32_t)osTime::GetTime();
                    connection->SendFlags(FLAG_ACK);
                }
                break;
            case TCPConnection::CLOSE_WAIT: break;
            case TCPConnection::CLOSING: break;
            case TCPConnection::LAST_ACK:
                if (ACK)
                {
                    connection->State = TCPConnection::CLOSED;
                }
                break;
            case TCPConnection::TIMED_WAIT: break;
            case TCPConnection::TTCP_PERSIST: break;
            }

            // Handle any data received
            if (connection && (connection->State == TCPConnection::ESTABLISHED ||
                               connection->State == TCPConnection::FIN_WAIT_1 ||
                               connection->State == TCPConnection::FIN_WAIT_2 ||
                               connection->State == TCPConnection::CLOSE_WAIT))
            {
                data = rxBuffer->Packet;
                dataLength = rxBuffer->Length;

                connection->MaxSequenceTx = AcknowledgementNumber + remoteWindowSize;
                connection->Event.Notify();

                // Handle any ACKed data
                if (ACK)
                {
                    connection->HoldingQueueLock.Take(__FILE__, __LINE__);
                    count = connection->HoldingQueue.GetCount();
                    time_us = (uint32_t)osTime::GetTime();
                    for (int i = 0; i < count; i++)
                    {
                        buffer = (DataBuffer*)connection->HoldingQueue.Get();
                        if ((int32_t)(AcknowledgementNumber - buffer->AcknowledgementNumber) >= 0)
                        {
                            connection->CalculateRTT((int32_t)(time_us - buffer->Time_us));
                            IP.FreeTxBuffer(buffer);
                        }
                        else
                        {
                            connection->HoldingQueue.Put(buffer);
                        }
                    }
                    connection->HoldingQueueLock.Give();
                }

                if (FIN)
                {
                    if (connection->State == TCPConnection::FIN_WAIT_1)
                    {
                        flags |= FLAG_ACK;
                        connection->State = TCPConnection::CLOSE_WAIT;
                    }
                    else if (connection->State == TCPConnection::ESTABLISHED)
                    {
                        connection->State = TCPConnection::CLOSE_WAIT;
                        flags |= FLAG_ACK;
                    }
                }

                // ACK the receipt of the data
                if (dataLength > 0)
                {
                    // Copy it to the application
                    rxBuffer->Disposable = false;
                    connection->StoreRxData(rxBuffer);
                    IP.FreeRxBuffer(rxBuffer);
                    connection->Event.Notify();
                }

                if (flags != 0)
                {
                    connection->SendFlags(flags);
                }
            }
        }
    }
    else
    {
        printf("TCP Checksum Failure\n");
    }
}